

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::MpUnknownEnumFallback
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  ParseContext *ctx_00;
  ulong uVar5;
  ushort *puVar6;
  uint *puVar7;
  
  uVar3 = (ulong)*ptr;
  if ((long)uVar3 < 0) {
    ctx_00 = (ParseContext *)((long)ptr[1] << 7 | 0x7f);
    if ((long)ctx_00 < 0) {
      uVar5 = (long)ptr[2] << 0xe | 0x3fff;
      if ((long)uVar5 < 0) {
        ctx_00 = (ParseContext *)((ulong)ctx_00 & ((long)ptr[3] << 0x15 | 0x1fffffU));
        if ((long)ctx_00 < 0) {
          uVar5 = uVar5 & ((long)ptr[4] << 0x1c | 0xfffffffU);
          if ((long)uVar5 < 0) {
            ctx_00 = (ParseContext *)((ulong)ctx_00 & ((long)ptr[5] << 0x23 | 0x7ffffffffU));
            if ((long)ctx_00 < 0) {
              uVar5 = uVar5 & ((long)ptr[6] << 0x2a | 0x3ffffffffffU);
              if ((long)uVar5 < 0) {
                ctx_00 = (ParseContext *)((ulong)ctx_00 & ((long)ptr[7] << 0x31 | 0x1ffffffffffffU))
                ;
                if ((long)ctx_00 < 0) {
                  uVar5 = uVar5 & ((ulong)(byte)ptr[8] << 0x38 | 0xffffffffffffff);
                  if ((long)uVar5 < 0) {
                    puVar6 = (ushort *)(ptr + 10);
                    if (ptr[9] != '\x01') {
                      bVar1 = ptr[9];
                      ptr = (char *)CONCAT71((int7)((ulong)ptr >> 8),bVar1);
                      if ((char)bVar1 < '\0') {
                        puVar6 = (ushort *)0x0;
                        goto LAB_00152890;
                      }
                      if ((bVar1 & 1) == 0) {
                        uVar5 = uVar5 ^ 0x8000000000000000;
                      }
                    }
                  }
                  else {
                    ptr = ptr + 9;
                    puVar6 = (ushort *)ptr;
                  }
                }
                else {
                  ptr = ptr + 8;
                  puVar6 = (ushort *)ptr;
                }
              }
              else {
                ptr = ptr + 7;
                puVar6 = (ushort *)ptr;
              }
            }
            else {
              ptr = ptr + 6;
              puVar6 = (ushort *)ptr;
            }
          }
          else {
            ptr = ptr + 5;
            puVar6 = (ushort *)ptr;
          }
        }
        else {
          ptr = ptr + 4;
          puVar6 = (ushort *)ptr;
        }
      }
      else {
        ptr = ptr + 3;
        puVar6 = (ushort *)ptr;
      }
      ctx_00 = (ParseContext *)((ulong)ctx_00 & uVar5);
    }
    else {
      ptr = ptr + 2;
      puVar6 = (ushort *)ptr;
    }
    uVar3 = uVar3 & (ulong)ctx_00;
  }
  else {
    ptr = ptr + 1;
    ctx_00 = ctx;
    puVar6 = (ushort *)ptr;
  }
LAB_00152890:
  if (puVar6 == (ushort *)0x0) {
    pcVar4 = Error(msg,ptr,ctx_00,data,table,hasbits);
    return pcVar4;
  }
  AddUnknownEnum(msg,table,data.field_0._0_4_,(int32_t)uVar3);
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar6) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar7 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar7 & 3) != 0) {
        AlignFail(puVar7);
      }
      *puVar7 = *puVar7 | (uint)hasbits;
    }
    return (char *)puVar6;
  }
  uVar2 = (uint)table->fast_idx_mask & (uint)*puVar6;
  if ((uVar2 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x44d);
  }
  uVar3 = (ulong)(uVar2 & 0xfffffff8);
  pcVar4 = (char *)(**(code **)(&table[1].has_bits_offset + uVar3))
                             (msg,puVar6,ctx,
                              (ulong)*puVar6 ^ *(ulong *)(&table[1].fast_idx_mask + uVar3 * 2),table
                              ,hasbits);
  return pcVar4;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpUnknownEnumFallback(
    PROTOBUF_TC_PARAM_DECL) {
  // Like FastUnknownEnumFallback, but with the Mp ABI.
  uint32_t tag = data.tag();
  uint64_t tmp;
  ptr = ParseVarint(ptr, &tmp);
  if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  AddUnknownEnum(msg, table, tag, static_cast<int32_t>(tmp));
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}